

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

bool __thiscall
Clasp::DefaultUnfoundedCheck::propagateFixpoint
          (DefaultUnfoundedCheck *this,Solver *s,PostPropagator *ctx)

{
  bool checkMin;
  bool bVar1;
  UfsType t;
  MinimalityCheck *this_00;
  
  if ((ctx == (PostPropagator *)0x0) &&
     (this_00 = (MinimalityCheck *)((this->mini_).ptr_ & 0xfffffffffffffffe),
     this_00 != (MinimalityCheck *)0x0)) {
    checkMin = MinimalityCheck::partialCheck(this_00,(s->levels_).super_type.ebo_.size);
  }
  else {
    checkMin = false;
  }
  do {
    t = findUfs(this,s,checkMin);
    if (t == ufs_none) goto LAB_0016f8fe;
    bVar1 = falsifyUfs(this,t);
  } while (bVar1);
  resetTodo(this);
LAB_0016f8fe:
  return t == ufs_none;
}

Assistant:

bool DefaultUnfoundedCheck::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	bool checkMin = ctx == 0 && mini_.get() && mini_->partialCheck(s.decisionLevel());
	for (UfsType t; (t = findUfs(s, checkMin)) != ufs_none; ) {
		if (!falsifyUfs(t)) {
			resetTodo();
			return false;
		}
	}
	return true;
}